

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeBee.cpp
# Opt level: O0

int TeeBee::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  Data *data_00;
  Data *data;
  float value_local;
  int index_local;
  UnityAudioEffectState *state_local;
  
  data_00 = (Data *)UnityAudioEffectState::GetEffectData<TeeBee::EffectData>(state);
  if (index < 0x11) {
    data_00->p[index] = value;
    if (((index == 0) || (index == 1)) || (index == 2)) {
      CalcPattern(data_00);
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = 1;
  }
  return state_local._4_4_;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_SEED || index == P_MINNOTE || index == P_MAXNOTE)
            CalcPattern(data);
        return UNITY_AUDIODSP_OK;
    }